

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpcollisionlist.h
# Opt level: O0

void __thiscall jrtplib::RTPCollisionList::~RTPCollisionList(RTPCollisionList *this)

{
  RTPCollisionList *this_local;
  
  (this->super_RTPMemoryObject)._vptr_RTPMemoryObject =
       (_func_int **)&PTR__RTPCollisionList_00191ce0;
  Clear(this);
  std::__cxx11::
  list<jrtplib::RTPCollisionList::AddressAndTime,_std::allocator<jrtplib::RTPCollisionList::AddressAndTime>_>
  ::~list(&this->addresslist);
  RTPMemoryObject::~RTPMemoryObject(&this->super_RTPMemoryObject);
  return;
}

Assistant:

~RTPCollisionList()								{ Clear(); }